

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

void SzAr_Free(CSzAr *p,ISzAlloc *alloc)

{
  CSzBitUi32s *in_RSI;
  CSzAr *in_RDI;
  ISzAlloc *in_stack_ffffffffffffffe8;
  
  (*(code *)in_RSI->Vals)(in_RSI,in_RDI->PackPositions);
  SzBitUi32s_Free(in_RSI,in_stack_ffffffffffffffe8);
  (*(code *)in_RSI->Vals)(in_RSI,in_RDI->FoCodersOffsets);
  (*(code *)in_RSI->Vals)(in_RSI,in_RDI->FoStartPackStreamIndex);
  (*(code *)in_RSI->Vals)(in_RSI,in_RDI->FoToCoderUnpackSizes);
  (*(code *)in_RSI->Vals)(in_RSI,in_RDI->FoToMainUnpackSizeIndex);
  (*(code *)in_RSI->Vals)(in_RSI,in_RDI->CoderUnpackSizes);
  (*(code *)in_RSI->Vals)(in_RSI,in_RDI->CodersData);
  SzAr_Init(in_RDI);
  return;
}

Assistant:

static void SzAr_Free(CSzAr *p, ISzAlloc *alloc)
{
  IAlloc_Free(alloc, p->PackPositions);
  SzBitUi32s_Free(&p->FolderCRCs, alloc);
 
  IAlloc_Free(alloc, p->FoCodersOffsets);
  IAlloc_Free(alloc, p->FoStartPackStreamIndex);
  IAlloc_Free(alloc, p->FoToCoderUnpackSizes);
  IAlloc_Free(alloc, p->FoToMainUnpackSizeIndex);
  IAlloc_Free(alloc, p->CoderUnpackSizes);
  
  IAlloc_Free(alloc, p->CodersData);

  SzAr_Init(p);
}